

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__surface
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  bool bVar1;
  surface__AttributeData *psVar2;
  StringHash SVar3;
  surface__AttributeData *psVar4;
  xmlChar **ppxVar5;
  bool bVar6;
  
  psVar2 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::surface__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar5 = attributes->attributes;
  if (ppxVar5 == (xmlChar **)0x0) {
    bVar6 = true;
  }
  else {
    while( true ) {
      text = *ppxVar5;
      bVar6 = text == (ParserChar *)0x0;
      if (bVar6) break;
      SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
      psVar4 = psVar2;
      if ((SVar3 == 0x79f4) || (psVar4 = (surface__AttributeData *)&psVar2->name, SVar3 == 0x74835))
      {
        psVar4->sid = ppxVar5[1];
      }
      else {
        bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0xac8c7e5,text,ppxVar5[1]);
        if (bVar1) {
          return bVar6;
        }
      }
      ppxVar5 = ppxVar5 + 2;
    }
  }
  return bVar6;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__surface( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__surface( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

surface__AttributeData* attributeData = newData<surface__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_SID:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__sid_type(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_SURFACE,
            HASH_ATTRIBUTE_SID,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_SURFACE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}